

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void emitfs(internal_state *state,int fs)

{
  uint8_t *puVar1;
  int local_14;
  int fs_local;
  internal_state *state_local;
  
  local_14 = fs;
  while (state->bits <= local_14) {
    local_14 = local_14 - state->bits;
    puVar1 = state->cds;
    state->cds = puVar1 + 1;
    puVar1[1] = '\0';
    state->bits = 8;
  }
  state->bits = state->bits - (local_14 + 1);
  *state->cds = *state->cds + (char)(1 << ((byte)state->bits & 0x1f));
  return;
}

Assistant:

static inline void emitfs(struct internal_state *state, int fs)
{
    /**
       Emits a fundamental sequence.

       fs zero bits followed by one 1 bit.
     */

    for(;;) {
        if (fs < state->bits) {
            state->bits -= fs + 1;
            *state->cds += 1U << state->bits;
            break;
        } else {
            fs -= state->bits;
            *++state->cds = 0;
            state->bits = 8;
        }
    }
}